

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O1

void __thiscall Layout::addItem(Layout *this,LayoutItem *item)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  if ((this->m_insertFlexSpacer == true) && (item->m_ltype == TYPE_CELL)) {
    p_Var2 = (_List_node_base *)operator_new(0x90);
    p_Var2->_M_next = (_List_node_base *)&PTR__LayoutItem_00144400;
    p_Var2->_M_prev = (_List_node_base *)0x0;
    p_Var2[1]._M_next = p_Var2 + 2;
    p_Var2[1]._M_prev = (_List_node_base *)0x0;
    *(undefined1 *)&p_Var2[2]._M_next = 0;
    p_Var2[3]._M_next = p_Var2 + 4;
    p_Var2[3]._M_prev = (_List_node_base *)0x0;
    *(undefined1 *)&p_Var2[4]._M_next = 0;
    p_Var2[5]._M_next = p_Var2 + 6;
    p_Var2[5]._M_prev = (_List_node_base *)0x0;
    *(undefined1 *)&p_Var2[6]._M_next = 0;
    p_Var2[7]._M_next = (_List_node_base *)0xbff0000000000000;
    p_Var2[7]._M_prev = (_List_node_base *)0xbff0000000000000;
    p_Var2[8]._M_next = (_List_node_base *)0xbff0000000000000;
    *(undefined1 *)&p_Var2[8]._M_prev = 0;
    *(undefined4 *)((long)&p_Var2[8]._M_prev + 4) = 3;
    (&p_Var2[7]._M_prev)[this->m_dir == DIR_HORIZONTAL] = (_List_node_base *)this->m_edgePos;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->m_items).super__List_base<LayoutItem_*,_std::allocator<LayoutItem_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)item;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->m_items).super__List_base<LayoutItem_*,_std::allocator<LayoutItem_*>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  this->m_insertFlexSpacer = item->m_ltype == TYPE_CELL;
  return;
}

Assistant:

void addItem(LayoutItem *item)
    {
        if ((m_insertFlexSpacer) &&
             (item->m_ltype == LayoutItem::TYPE_CELL))
        {
            LayoutItem *flex = new LayoutItem(LayoutItem::TYPE_FLEXSPACE);
            flex->m_size = -1;
            setItemEdgePos(flex);
            m_items.push_back(flex);
        }

        m_items.push_back(item);
        
        if (item->m_ltype == LayoutItem::TYPE_CELL)
        {
            // auto-insert a flex space the next time
            // a regular CELL is inserted.
            //
            // this way, there will always be a flex
            // space between regular cells unless
            // we insert a fixed spacer or offset.
            m_insertFlexSpacer = true;
        }
        else
        {
            m_insertFlexSpacer = false;
        }
    }